

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitStructNew(WasmBinaryBuilder *this,Expression **out,uint32_t code)

{
  Struct *this_00;
  Expression *pEVar1;
  reference ppEVar2;
  StructNew *pSVar3;
  Builder local_68;
  uint local_60;
  Index i;
  size_type local_50;
  size_type numOperands;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  HeapType heapType;
  uint32_t code_local;
  Expression **out_local;
  WasmBinaryBuilder *this_local;
  
  if ((code == 7) || (code == 8)) {
    operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)getIndexedHeapType(this);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&numOperands);
    if (code == 7) {
      this_00 = HeapType::getStruct((HeapType *)
                                    &operands.
                                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_50 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this_00->fields);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::resize
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&numOperands,
                 local_50);
      for (local_60 = 0; local_60 < local_50; local_60 = local_60 + 1) {
        pEVar1 = popNonVoidExpression(this);
        ppEVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &numOperands,(local_50 - local_60) - 1);
        *ppEVar2 = pEVar1;
      }
    }
    Builder::Builder(&local_68,this->wasm);
    pSVar3 = Builder::
             makeStructNew<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                       (&local_68,
                        (HeapType)
                        operands.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                        &numOperands);
    *out = (Expression *)pSVar3;
    this_local._7_1_ = true;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&numOperands);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitStructNew(Expression*& out, uint32_t code) {
  if (code == BinaryConsts::StructNew ||
      code == BinaryConsts::StructNewDefault) {
    auto heapType = getIndexedHeapType();
    std::vector<Expression*> operands;
    if (code == BinaryConsts::StructNew) {
      auto numOperands = heapType.getStruct().fields.size();
      operands.resize(numOperands);
      for (Index i = 0; i < numOperands; i++) {
        operands[numOperands - i - 1] = popNonVoidExpression();
      }
    }
    out = Builder(wasm).makeStructNew(heapType, operands);
    return true;
  }
  return false;
}